

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,char *name,Box2i *displayWindow,Box2i *dataWindow,
          RgbaChannels rgbaChannels,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression,int numThreads)

{
  bool bVar1;
  V2f VVar2;
  Header *in_RCX;
  Header *in_RDX;
  ToYca *in_RSI;
  V2f *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  Header *unaff_retaddr;
  Header hd;
  int in_stack_0000016c;
  Header *in_stack_00000170;
  char *in_stack_00000178;
  OutputFile *in_stack_00000180;
  Header *this_00;
  Box2i *in_stack_ffffffffffffff80;
  Box2i *in_stack_ffffffffffffff88;
  Header *in_stack_ffffffffffffff90;
  RgbaChannels rgbaChannels_00;
  Header *outputFile;
  V2f *pVVar3;
  RgbaChannels rgbaChannels_01;
  
  *in_RDI = (V2f)&PTR__RgbaOutputFile_002acfb0;
  in_RDI[1].x = 0.0;
  in_RDI[1].y = 0.0;
  in_RDI[2].x = 0.0;
  in_RDI[2].y = 0.0;
  outputFile = in_RDX;
  pVVar3 = in_RDI;
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::isEmpty((Box<Imath_3_2::Vec2<int>_> *)in_RCX);
  rgbaChannels_01 = (RgbaChannels)((ulong)pVVar3 >> 0x20);
  this_00 = outputFile;
  if (!bVar1) {
    this_00 = in_RCX;
  }
  Header::Header(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 (float)((ulong)in_RDX >> 0x20),in_RDI,(float)((ulong)in_R9 >> 0x20),
                 (LineOrder)in_R9,(Compression)((ulong)this_00 >> 0x20));
  rgbaChannels_00 = (RgbaChannels)((ulong)in_RCX >> 0x20);
  anon_unknown_1::insertChannels(unaff_retaddr,rgbaChannels_01);
  VVar2 = (V2f)operator_new(0x10);
  OutputFile::OutputFile(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_0000016c);
  in_RDI[1] = VVar2;
  if ((in_R8D & 0x30) != 0) {
    VVar2 = (V2f)operator_new(0x160);
    ToYca::ToYca(in_RSI,(OutputFile *)outputFile,rgbaChannels_00);
    in_RDI[2] = VVar2;
  }
  Header::~Header(this_00);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (
    const char                    name[],
    const IMATH_NAMESPACE::Box2i& displayWindow,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    RgbaChannels                  rgbaChannels,
    float                         pixelAspectRatio,
    const IMATH_NAMESPACE::V2f    screenWindowCenter,
    float                         screenWindowWidth,
    LineOrder                     lineOrder,
    Compression                   compression,
    int                           numThreads)
    : _outputFile (0), _toYca (0)
{
    Header hd (
        displayWindow,
        dataWindow.isEmpty () ? displayWindow : dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (name, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
        _toYca = new ToYca (*_outputFile, rgbaChannels);
}